

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O3

bool ReadHFE(MemFile *file,shared_ptr<Disk> *disk)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  ushort uVar3;
  Disk *this;
  element_type *peVar4;
  uint uVar5;
  char extraout_AL;
  bool bVar6;
  byte bVar7;
  ssize_t sVar8;
  mapped_type *pmVar9;
  long *plVar10;
  exception *peVar11;
  size_t in_RCX;
  ulong __nbytes;
  size_t __n;
  long *plVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  unsigned_short data_bitrate;
  string __str;
  HFE_HEADER hh;
  int track_lut_offset;
  BitBuffer bitbuf;
  HFE_TRACK aTrackLUT [256];
  DataRate local_52c;
  ushort local_522;
  shared_ptr<Disk> *local_520;
  key_type local_518;
  ulong local_4f8;
  uint8_t *local_4f0;
  long local_4e6;
  uchar local_4de;
  byte local_4dd;
  byte local_4dc;
  byte local_4db;
  ushort local_4da;
  ushort local_4d8;
  byte local_4d6;
  ushort local_4d4;
  uint local_4cc;
  uint local_4c8;
  int local_4c4;
  undefined1 local_4c0 [32];
  pointer local_4a0;
  pointer local_490;
  pointer local_488;
  pointer local_478;
  key_type local_458;
  ushort local_438 [516];
  
  local_520 = disk;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar8 = MemFile::read(file,(int)&local_4e6,(void *)0x1a,in_RCX), (char)sVar8 == '\0')) ||
     (local_4e6 != 0x4546434950435848)) {
    return false;
  }
  if (local_4de == '\0') {
    local_4c4 = (uint)local_4d4 << 9;
    bVar6 = MemFile::seek(file,local_4c4);
    if ((bVar6) &&
       (sVar8 = MemFile::read(file,(int)local_438,(void *)0x400,in_RCX), (char)sVar8 != '\0')) {
      local_522 = local_4da;
      local_52c = _250K;
      if ((((ushort)(local_4da - 0xf0) < 0x15) ||
          (local_52c = _300K, (ushort)(local_4da - 0x122) < 0x15)) ||
         (local_52c = _500K, (ushort)(local_4da - 0x1ea) < 0x15)) {
        local_4f8 = 0;
        Format::Validate((uint)local_4dd,(uint)local_4dc,1,0x200,0);
        local_4f0 = AllocMem(0x10000);
        if (local_4dd != 0) {
          __nbytes = (ulong)local_4dc;
          bVar7 = local_4dd;
          do {
            uVar14 = 0;
            if ((char)__nbytes == '\0') {
              __nbytes = 0;
            }
            else {
              uVar3 = local_438[local_4f8 * 2 + 1];
              __nbytes = (ulong)uVar3;
              local_4c8 = (uint)uVar3;
              uVar15 = (uint)(uVar3 >> 1);
              iVar13 = (uint)local_438[local_4f8 * 2] << 9;
              local_4cc = uVar15 * 8;
              do {
                iVar16 = iVar13 + 0x100;
                if (uVar14 != 1) {
                  iVar16 = iVar13;
                }
                iVar13 = iVar16;
                if (1 < (ushort)local_4c8) {
                  iVar16 = 0;
                  do {
                    uVar5 = uVar15 - iVar16;
                    if (0xff < (int)(uVar15 - iVar16)) {
                      uVar5 = 0x100;
                    }
                    bVar6 = MemFile::seek(file,iVar13 + iVar16 * 2);
                    if ((!bVar6) ||
                       (sVar8 = MemFile::read(file,iVar16 + (int)local_4f0,(void *)(ulong)uVar5,
                                              __nbytes), (char)sVar8 == '\0')) {
                      peVar11 = (exception *)__cxa_allocate_exception(0x10);
                      local_4c0._0_8_ = CH((int)local_4f8,uVar14);
                      util::exception::exception<char_const(&)[28],char_const*>
                                (peVar11,(char (*) [28])"EOF reading track data for ",
                                 (char **)local_4c0);
                      __cxa_throw(peVar11,&util::exception::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    iVar16 = uVar5 + iVar16;
                  } while (iVar16 < (int)uVar15);
                }
                __n = (size_t)local_4cc;
                BitBuffer::BitBuffer((BitBuffer *)local_4c0,local_52c,local_4f0,local_4cc);
                this = (local_520->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                CylHead::CylHead((CylHead *)&local_518,(int)local_4f8,uVar14);
                Disk::write(this,(int)&local_518,(BitBuffer *)local_4c0,__n);
                if (local_488 != (pointer)0x0) {
                  operator_delete(local_488,(long)local_478 - (long)local_488);
                }
                if (local_4a0 != (pointer)0x0) {
                  operator_delete(local_4a0,(long)local_490 - (long)local_4a0);
                }
                if ((pointer)local_4c0._8_8_ != (pointer)0x0) {
                  operator_delete((void *)local_4c0._8_8_,
                                  CONCAT44(local_4c0._28_4_,local_4c0._24_4_) - local_4c0._8_8_);
                }
                uVar14 = uVar14 + 1;
                __nbytes = (ulong)local_4dc;
                bVar7 = local_4dd;
              } while (uVar14 < local_4dc);
            }
            local_4f8 = local_4f8 + 1;
          } while (local_4f8 < bVar7);
        }
        to_string_abi_cxx11_((string *)local_4c0,(uint)local_4d6);
        peVar4 = (local_520->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        paVar1 = &local_518.field_2;
        local_518._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"interface_mode","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&peVar4->metadata,&local_518);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)local_4c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != paVar1) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = local_4c0 + 0x10;
        if ((char *)local_4c0._0_8_ != pcVar2) {
          operator_delete((void *)local_4c0._0_8_,(ulong)(local_4c0._16_8_ + 1));
        }
        to_string_abi_cxx11_((string *)local_4c0,(uint)local_4db);
        peVar4 = (local_520->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_518._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"track_encoding","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&peVar4->metadata,&local_518);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)local_4c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != paVar1) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_4c0._0_8_ != pcVar2) {
          operator_delete((void *)local_4c0._0_8_,(ulong)(local_4c0._16_8_ + 1));
        }
        uVar14 = 1;
        if (((9 < local_4da) && (uVar14 = 2, 99 < local_4da)) && (uVar14 = 3, 999 < local_4da)) {
          uVar14 = 5 - (local_4da < 10000);
        }
        local_518._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_518,(char)uVar14);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_518._M_dataplus._M_p,uVar14,(uint)local_4da);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_518);
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          local_4c0._16_8_ = *plVar12;
          local_4c0._24_4_ = (undefined4)plVar10[3];
          local_4c0._28_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
          local_4c0._0_8_ = pcVar2;
        }
        else {
          local_4c0._16_8_ = *plVar12;
          local_4c0._0_8_ = (long *)*plVar10;
        }
        local_4c0._8_8_ = plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        peVar4 = (local_520->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"data_bitrate","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&peVar4->metadata,&local_458);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)local_4c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_4c0._0_8_ != pcVar2) {
          operator_delete((void *)local_4c0._0_8_,(ulong)(local_4c0._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != paVar1) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if (local_4d8 != 0) {
          uVar15 = 1;
          uVar14 = (uint)local_4d8;
          if (((9 < local_4d8) && (uVar15 = 2, 99 < local_4d8)) && (uVar15 = 3, 999 < uVar14)) {
            uVar15 = 5 - (uVar14 < 10000);
          }
          local_4c0._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct((ulong)local_4c0,(char)uVar15);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4c0._0_8_,uVar15,uVar14);
          peVar4 = (local_520->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_518._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"floppy_rpm","");
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&peVar4->metadata,&local_518);
          std::__cxx11::string::operator=((string *)pmVar9,(string *)local_4c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != paVar1) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_4c0._0_8_ != pcVar2) {
            operator_delete((void *)local_4c0._0_8_,(ulong)(local_4c0._16_8_ + 1));
          }
        }
        peVar4 = (local_520->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::_M_replace
                  ((ulong)&peVar4->strType,0,(char *)(peVar4->strType)._M_string_length,0x1b0d40);
        FreeMem(local_4f0);
        return true;
      }
      peVar11 = (exception *)__cxa_allocate_exception(0x10);
      if (local_4da == 0xffff) {
        util::exception::exception<char_const(&)[42]>
                  (peVar11,(char (*) [42])"variable bitrate images are not supported");
      }
      else {
        util::exception::exception<char_const(&)[24],unsigned_short&,char_const(&)[6]>
                  (peVar11,(char (*) [24])"unsupported data rate (",&local_522,(char (*) [6])"Kbps)"
                  );
      }
    }
    else {
      peVar11 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28],int&,char_const(&)[2]>
                (peVar11,(char (*) [28])"failed to read track LUT (@",&local_4c4,
                 (char (*) [2])0x1aefd0);
    }
  }
  else {
    peVar11 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[34],unsigned_char&,char_const(&)[2]>
              (peVar11,(char (*) [34])"unsupported HFE format revision (",&local_4de,
               (char (*) [2])0x1aefd0);
  }
  __cxa_throw(peVar11,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadHFE(MemFile& file, std::shared_ptr<Disk>& disk)
{
    HFE_HEADER hh;
    if (!file.rewind() || !file.read(&hh, sizeof(hh)) || memcmp(&hh.header_signature, HFE_SIGNATURE, sizeof(hh.header_signature)))
        return false;

    if (hh.format_revision != 0)
        throw util::exception("unsupported HFE format revision (", hh.format_revision, ")");

    HFE_TRACK aTrackLUT[256];
    auto track_lut_offset = util::letoh(hh.track_list_offset) << 9;
    if (!file.seek(track_lut_offset) || !file.read(aTrackLUT, sizeof(aTrackLUT)))
        throw util::exception("failed to read track LUT (@", track_lut_offset, ")");

    auto datarate = DataRate::Unknown;
    auto data_bitrate = util::letoh(hh.bitrate_kbps);
    if (data_bitrate >= 240 && data_bitrate <= 260)
        datarate = DataRate::_250K;
    else if (data_bitrate >= 290 && data_bitrate <= 310)
        datarate = DataRate::_300K;
    else if (data_bitrate >= 490 && data_bitrate <= 510)
        datarate = DataRate::_500K;
    else if (data_bitrate == 0xffff)
        throw util::exception("variable bitrate images are not supported");
    else
        throw util::exception("unsupported data rate (", data_bitrate, "Kbps)");

    Format::Validate(hh.number_of_tracks, hh.number_of_sides);

    // 64K should be enough for maximum MFM track size, and we'll check later anyway
    MEMORY mem(0x10000);
    auto pbTrack = mem.pb;

    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        // Offset is in 512-byte blocks, data length covers both heads
        auto uTrackDataOffset = util::letoh(aTrackLUT[cyl].offset) << 9;
        auto uTrackDataLen = util::letoh(aTrackLUT[cyl].track_len) >> 1;

        if (uTrackDataLen > mem.size)
            throw util::exception("invalid track size (", uTrackDataLen, ") for track ", CylStr(cyl));

        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            // Head 1 data starts 256 bytes in
            if (head == 1)
                uTrackDataOffset += 256;

            auto uRead = 0;
            while (uRead < uTrackDataLen)
            {
                auto chunk = std::min(uTrackDataLen - uRead, 256);

                // Read the next interleaved chunk
                if (!file.seek(uTrackDataOffset + (uRead * 2)) || !file.read(pbTrack + uRead, chunk))
                    throw util::exception("EOF reading track data for ", CH(cyl, head));

                uRead += chunk;
            }

            BitBuffer bitbuf(datarate, pbTrack, uTrackDataLen * 8);
            disk->write(CylHead(cyl, head), std::move(bitbuf));
        }
    }

    disk->metadata["interface_mode"] = to_string(static_cast<FloppyInterfaceMode>(hh.floppy_interface_mode));
    disk->metadata["track_encoding"] = to_string(static_cast<TrackEncoding>(hh.track_encoding));
    disk->metadata["data_bitrate"] = std::to_string(hh.bitrate_kbps) + "Kbps";
    if (hh.floppy_rpm)
        disk->metadata["floppy_rpm"] = std::to_string(hh.floppy_rpm);

    disk->strType = "HFE";
    return true;
}